

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::anon_unknown_1::ArgConverter<signed_char>::visit_any_int<int>
          (ArgConverter<signed_char> *this,int value)

{
  Arg *pAVar1;
  uint uVar2;
  
  if ((this->type_ == L'i') || (this->type_ == L'd')) {
    pAVar1 = this->arg_;
    pAVar1->type = INT;
    uVar2 = (uint)(char)value;
  }
  else {
    pAVar1 = this->arg_;
    pAVar1->type = UINT;
    uVar2 = value & 0xff;
  }
  *(uint *)&(pAVar1->super_Value).field_0 = uVar2;
  return;
}

Assistant:

void visit_any_int(U value) {
    bool is_signed = type_ == 'd' || type_ == 'i';
    using internal::Arg;
    typedef typename internal::Conditional<
        is_same<T, void>::value, U, T>::type TargetType;
    if (sizeof(TargetType) <= sizeof(int)) {
      // Extra casts are used to silence warnings.
      if (is_signed) {
        arg_.type = Arg::INT;
        arg_.int_value = static_cast<int>(static_cast<TargetType>(value));
      } else {
        arg_.type = Arg::UINT;
        typedef typename internal::MakeUnsigned<TargetType>::Type Unsigned;
        arg_.uint_value = static_cast<unsigned>(static_cast<Unsigned>(value));
      }
    } else {
      if (is_signed) {
        arg_.type = Arg::LONG_LONG;
        // glibc's printf doesn't sign extend arguments of smaller types:
        //   std::printf("%lld", -42);  // prints "4294967254"
        // but we don't have to do the same because it's a UB.
        arg_.long_long_value = static_cast<LongLong>(value);
      } else {
        arg_.type = Arg::ULONG_LONG;
        arg_.ulong_long_value =
            static_cast<typename internal::MakeUnsigned<U>::Type>(value);
      }
    }
  }